

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapExternalFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  Var fname;
  RecyclableObject *pRVar2;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag == SnapExternalFunctionObject) {
    if (snpObject->AddtlSnapObjectInfo == (TTDVar)0x0) {
      fname = (Var)0x0;
    }
    else {
      fname = InflateMap::InflateTTDVar(inflator,snpObject->AddtlSnapObjectInfo);
    }
    pRVar2 = Js::JavascriptLibrary::CreateExternalFunction_TTD
                       ((pSVar1->super_ScriptContextBase).javascriptLibrary,fname);
    return pRVar2;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapExternalFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            TTDVar snapVar = SnapObjectGetAddtlInfoAs<TTDVar, SnapObjectType::SnapExternalFunctionObject>(snpObject);

            Js::Var fname = (snapVar != nullptr) ? inflator->InflateTTDVar(snapVar) : nullptr;
            return ctx->GetLibrary()->CreateExternalFunction_TTD(fname);
        }